

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covariance_matrix_generator.cc
# Opt level: O0

void webrtc::CovarianceMatrixGenerator::AngledCovarianceMatrix
               (float sound_speed,float angle,size_t frequency_bin,size_t fft_size,
               size_t num_freq_bins,int sample_rate,
               vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
               *geometry,ComplexMatrix<float> *mat)

{
  pointer *this;
  size_type sVar1;
  float local_464;
  undefined1 local_460 [8];
  ComplexMatrix<float> interf_cov_vector_transposed;
  ComplexMatrix<float> interf_cov_vector;
  size_t local_1f8;
  size_type local_1f0;
  string *local_1e8;
  string *_result_1;
  FatalMessage local_1d0;
  size_t local_58;
  size_type local_50;
  string *local_48;
  string *_result;
  ComplexMatrix<float> *mat_local;
  vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  *geometry_local;
  size_t sStack_28;
  int sample_rate_local;
  size_t num_freq_bins_local;
  size_t fft_size_local;
  size_t frequency_bin_local;
  float angle_local;
  float sound_speed_local;
  
  _result = (string *)mat;
  mat_local = (ComplexMatrix<float> *)geometry;
  geometry_local._4_4_ = sample_rate;
  sStack_28 = num_freq_bins;
  num_freq_bins_local = fft_size;
  fft_size_local = frequency_bin;
  frequency_bin_local._0_4_ = angle;
  frequency_bin_local._4_4_ = sound_speed;
  local_50 = std::
             vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             ::size(geometry);
  local_58 = Matrix<std::complex<float>_>::num_rows((Matrix<std::complex<float>_> *)_result);
  local_48 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       (&local_50,&local_58,"geometry.size() == mat->num_rows()");
  if (local_48 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/covariance_matrix_generator.cc"
               ,0x47,local_48);
    rtc::FatalMessage::stream(&local_1d0);
    rtc::FatalMessage::~FatalMessage(&local_1d0);
  }
  local_1f0 = std::
              vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              ::size((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                      *)mat_local);
  local_1f8 = Matrix<std::complex<float>_>::num_columns((Matrix<std::complex<float>_> *)_result);
  local_1e8 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                        (&local_1f0,&local_1f8,"geometry.size() == mat->num_columns()");
  if (local_1e8 != (string *)0x0) {
    this = &interf_cov_vector.super_Matrix<std::complex<float>_>.scratch_elements_.
            super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)this,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/covariance_matrix_generator.cc"
               ,0x48,local_1e8);
    rtc::FatalMessage::stream((FatalMessage *)this);
    rtc::FatalMessage::~FatalMessage
              ((FatalMessage *)
               &interf_cov_vector.super_Matrix<std::complex<float>_>.scratch_elements_.
                super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  sVar1 = std::
          vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>::
          size((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                *)mat_local);
  ComplexMatrix<float>::ComplexMatrix
            ((ComplexMatrix<float> *)
             &interf_cov_vector_transposed.super_Matrix<std::complex<float>_>.scratch_elements_.
              super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,1,sVar1);
  sVar1 = std::
          vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>::
          size((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                *)mat_local);
  ComplexMatrix<float>::ComplexMatrix((ComplexMatrix<float> *)local_460,sVar1,1);
  PhaseAlignmentMasks(fft_size_local,num_freq_bins_local,geometry_local._4_4_,
                      frequency_bin_local._4_4_,
                      (vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                       *)mat_local,(float)frequency_bin_local,
                      (ComplexMatrix<float> *)
                      &interf_cov_vector_transposed.super_Matrix<std::complex<float>_>.
                       scratch_elements_.
                       super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_464 = anon_unknown_3::Norm
                        ((ComplexMatrix<float> *)
                         &interf_cov_vector_transposed.super_Matrix<std::complex<float>_>.
                          scratch_elements_.
                          super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_464 = 1.0 / local_464;
  Matrix<std::complex<float>_>::Scale<float>
            ((Matrix<std::complex<float>_> *)
             &interf_cov_vector_transposed.super_Matrix<std::complex<float>_>.scratch_elements_.
              super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_464);
  Matrix<std::complex<float>_>::Transpose
            ((Matrix<std::complex<float>_> *)local_460,
             (Matrix<std::complex<float>_> *)
             &interf_cov_vector_transposed.super_Matrix<std::complex<float>_>.scratch_elements_.
              super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ComplexMatrix<float>::PointwiseConjugate
            ((ComplexMatrix<float> *)
             &interf_cov_vector_transposed.super_Matrix<std::complex<float>_>.scratch_elements_.
              super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  Matrix<std::complex<float>_>::Multiply
            ((Matrix<std::complex<float>_> *)_result,(Matrix<std::complex<float>_> *)local_460,
             (Matrix<std::complex<float>_> *)
             &interf_cov_vector_transposed.super_Matrix<std::complex<float>_>.scratch_elements_.
              super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ComplexMatrix<float>::~ComplexMatrix((ComplexMatrix<float> *)local_460);
  ComplexMatrix<float>::~ComplexMatrix
            ((ComplexMatrix<float> *)
             &interf_cov_vector_transposed.super_Matrix<std::complex<float>_>.scratch_elements_.
              super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CovarianceMatrixGenerator::AngledCovarianceMatrix(
    float sound_speed,
    float angle,
    size_t frequency_bin,
    size_t fft_size,
    size_t num_freq_bins,
    int sample_rate,
    const std::vector<Point>& geometry,
    ComplexMatrix<float>* mat) {
  RTC_CHECK_EQ(geometry.size(), mat->num_rows());
  RTC_CHECK_EQ(geometry.size(), mat->num_columns());

  ComplexMatrix<float> interf_cov_vector(1, geometry.size());
  ComplexMatrix<float> interf_cov_vector_transposed(geometry.size(), 1);
  PhaseAlignmentMasks(frequency_bin,
                      fft_size,
                      sample_rate,
                      sound_speed,
                      geometry,
                      angle,
                      &interf_cov_vector);
  interf_cov_vector.Scale(1.f / Norm(interf_cov_vector));
  interf_cov_vector_transposed.Transpose(interf_cov_vector);
  interf_cov_vector.PointwiseConjugate();
  mat->Multiply(interf_cov_vector_transposed, interf_cov_vector);
}